

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeParser.hpp
# Opt level: O1

void __thiscall antlr::TreeParser::match(TreeParser *this,RefAST *t,BitSet *b)

{
  ASTRef *pAVar1;
  bool bVar2;
  uint el;
  int iVar3;
  int numTokens_;
  MismatchedTokenException *this_00;
  undefined4 extraout_var;
  AST *pAVar4;
  AST *pAVar5;
  RefAST local_60;
  BitSet local_58;
  
  pAVar1 = t->ref;
  if ((pAVar1 != (ASTRef *)0x0) && (pAVar1->ptr != (AST *)0x0)) {
    if (pAVar1 == (ASTRef *)0x0) {
      pAVar4 = (AST *)0x0;
    }
    else {
      pAVar4 = pAVar1->ptr;
    }
    if (ASTNULL == (long *)0x0) {
      pAVar5 = (AST *)0x0;
    }
    else {
      pAVar5 = (AST *)*ASTNULL;
    }
    if (pAVar4 != pAVar5) {
      el = (*pAVar1->ptr->_vptr_AST[0x10])();
      bVar2 = BitSet::member(b,el);
      if (bVar2) {
        return;
      }
    }
  }
  this_00 = (MismatchedTokenException *)__cxa_allocate_exception(200);
  iVar3 = (*this->_vptr_TreeParser[8])(this);
  numTokens_ = (*this->_vptr_TreeParser[7])(this);
  local_60 = (RefAST)t->ref;
  if (local_60.ref == (ASTRef *)0x0) {
    local_60.ref = (ASTRef *)0x0;
  }
  else {
    (local_60.ref)->count = (local_60.ref)->count + 1;
  }
  std::vector<bool,_std::allocator<bool>_>::vector(&local_58.storage,&b->storage);
  MismatchedTokenException::MismatchedTokenException
            (this_00,(char **)CONCAT44(extraout_var,iVar3),numTokens_,&local_60,&local_58,false);
  __cxa_throw(this_00,&MismatchedTokenException::typeinfo,
              MismatchedTokenException::~MismatchedTokenException);
}

Assistant:

virtual void match(RefAST t, const BitSet& b)
	{
		if ( !t || t==ASTNULL || !b.member(t->getType()) )
			throw MismatchedTokenException( getTokenNames(), getNumTokens(),
													  t, b, false );
	}